

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeCoordMappingTests.cpp
# Opt level: O2

bool deqp::egl::anon_unknown_0::validate
               (TestLog *log,TextureLevel *result,int rectX,int rectY,int rectW,int rectH)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  ConstPixelBufferAccess *pCVar4;
  void *__buf;
  void *__buf_00;
  int y;
  int z;
  int y_00;
  allocator<char> local_186;
  allocator<char> local_185;
  uint local_184;
  Surface errorMask;
  string local_148;
  string local_128;
  Vec4 local_108;
  Vec4 local_f8;
  Vec4 resultColor;
  LogImage local_c0;
  
  local_f8.m_data[0] = 0.0;
  local_f8.m_data[1] = 0.0;
  local_f8.m_data[2] = 0.0;
  local_f8.m_data[3] = 1.0;
  local_108.m_data[0] = 1.0;
  local_108.m_data[1] = 1.0;
  local_108.m_data[2] = 1.0;
  local_108.m_data[3] = 1.0;
  tcu::Surface::Surface(&errorMask,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  z = 0;
  local_184 = (uint)CONCAT71((uint7)(uint3)((uint)(rectX + 0x48) >> 8),1);
  do {
    if ((result->m_size).m_data[1] <= z) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"Result",&local_185);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"Result of rendering",&local_186);
      uVar1 = local_184;
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)&resultColor,result);
      pCVar4 = (ConstPixelBufferAccess *)&resultColor;
      tcu::LogImage::LogImage(&local_c0,&local_128,&local_148,pCVar4,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write(&local_c0,(int)log,__buf,(size_t)pCVar4);
      tcu::LogImage::~LogImage(&local_c0);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_128);
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"Error Mask",&local_185);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_148,"Error Mask",&local_186);
        tcu::Surface::getAccess((PixelBufferAccess *)&resultColor,&errorMask);
        pCVar4 = (ConstPixelBufferAccess *)&resultColor;
        tcu::LogImage::LogImage
                  (&local_c0,&local_128,&local_148,pCVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_c0,(int)log,__buf_00,(size_t)pCVar4);
        tcu::LogImage::~LogImage(&local_c0);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_128);
      }
      tcu::Surface::~Surface(&errorMask);
      return (bool)((byte)uVar1 & 1);
    }
    for (y_00 = 0; y_00 < (result->m_size).m_data[0]; y_00 = y_00 + 1) {
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)&local_c0,result);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&resultColor,(int)&local_c0,y_00,z);
      if (((z < rectX + 0x47) && (rectX < z)) && (y_00 - 9U < 0x3e)) {
        bVar2 = compareColor(&resultColor,&local_108);
LAB_00ddd34a:
        lVar3 = (long)(y_00 + errorMask.m_width * z);
        if (bVar2 == false) {
          *(undefined4 *)((long)errorMask.m_pixels.m_ptr + lVar3 * 4) = 0xff0000ff;
LAB_00ddd3c8:
          local_184 = 0;
        }
        else {
          *(undefined4 *)((long)errorMask.m_pixels.m_ptr + lVar3 * 4) = 0xff00ff00;
        }
      }
      else {
        bVar2 = compareColor(&resultColor,&local_f8);
        if (((rectX + 0x48 < z) || (z < rectX + -1)) || (y_00 - 0x49U < 0xffffffbe))
        goto LAB_00ddd34a;
        if (!bVar2) {
          bVar2 = compareColor(&resultColor,&local_108);
          if (bVar2) goto LAB_00ddd3a6;
          *(undefined4 *)((long)errorMask.m_pixels.m_ptr + (long)(y_00 + errorMask.m_width * z) * 4)
               = 0xff0000ff;
          goto LAB_00ddd3c8;
        }
LAB_00ddd3a6:
        *(undefined4 *)((long)errorMask.m_pixels.m_ptr + (long)(y_00 + errorMask.m_width * z) * 4) =
             0xff00ff00;
      }
    }
    z = z + 1;
  } while( true );
}

Assistant:

bool validate (TestLog& log, const tcu::TextureLevel& result, int rectX, int rectY, int rectW, int rectH)
{
	const tcu::Vec4		black		(0.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4		white		(1.0f, 1.0f, 1.0f, 1.0f);
	tcu::Surface		errorMask	(result.getWidth(), result.getHeight());
	bool				isOk		= true;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			const tcu::Vec4 resultColor = result.getAccess().getPixel(x, y);

			if (x > rectX && x < rectX + rectW - 1 && y > rectY && y < rectY + rectH - 1)
			{
				if (!compareColor(resultColor, white))
				{
					errorMask.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					isOk = false;
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA(0, 255, 0, 255));
			}
			else if (x < rectX-1 || x > rectX + rectW || y < rectY-1 || y > rectY + rectH)
			{
				if (!compareColor(resultColor, black))
				{
					errorMask.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					isOk = false;
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA(0, 255, 0, 255));
			}
			else
			{
				// Pixel is close to edge of reference rectangle

				if (!compareColor(resultColor, black) && !compareColor(resultColor, white))
				{
					errorMask.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					isOk = false;
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA(0, 255, 0, 255));
			}
		}
	}

	log << TestLog::Image("Result", "Result of rendering", result.getAccess());

	if (!isOk)
		log << TestLog::Image("Error Mask", "Error Mask", errorMask.getAccess());

	return isOk;
}